

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::NegativeTest7::test
          (NegativeTest7 *this,GLchar *vertex_shader_code,GLchar *name_of_recursive_routine)

{
  GLchar *pGVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *__filename;
  allocator<char> local_251;
  GLchar *name_of_recursive_routine_local;
  string local_248;
  program program;
  uint local_1f4;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  name_of_recursive_routine_local = name_of_recursive_routine;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,vertex_shader_code,&local_251);
  program._0_8_ = &program.m_tesselation_control_shader_id;
  std::__cxx11::string::_M_construct<char_const*>((string *)&program,0x1b3c1e9);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,0x1b3c1e9);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,0x1b3c1e9);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,0x1b3c1e9);
  local_1f4 = 1;
  bVar2 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar3),(string *)local_1b0,
                              (string *)&program,&local_248,&local_1d0,&local_1f0,
                              &test::varying_name,&local_1f4,&this->m_vertex_shader_id,(GLuint *)0x0
                              ,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,&this->m_program_id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((GLuint *)program._0_8_ != &program.m_tesselation_control_shader_id) {
    operator_delete((void *)program._0_8_,
                    CONCAT44(program.m_tesselation_evaluation_shader_id,
                             program.m_tesselation_control_shader_id) + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if (bVar2) {
    program.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               vertex_shader_code,(GLchar **)0x0,0,false);
    Utils::program::getSubroutineIndex(&program,name_of_recursive_routine_local,0x8b31);
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Error. Program with potentially recursive subroutine, ",0x36);
    pGVar1 = name_of_recursive_routine_local;
    iVar3 = (int)(ostringstream *)&local_1a8;
    if (name_of_recursive_routine_local == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(name_of_recursive_routine_local);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pGVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", which is active, index: ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,", has been built successfully.\n",0x1f);
    if (vertex_shader_code == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(vertex_shader_code);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,vertex_shader_code,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    __filename = &std::__cxx11::ostringstream::VTT;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    Utils::program::remove(&program,__filename);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
  return !bVar2;
}

Assistant:

bool NegativeTest7::test(const GLchar* vertex_shader_code, const GLchar* name_of_recursive_routine)
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	bool				  result	   = true;
	static const GLchar*  varying_name = "out_result";

	/* Try to build program */
	if (true == Utils::buildProgram(gl, vertex_shader_code, "", "", "", "", &varying_name /* varying_names */,
									1 /* n_varyings */, &m_vertex_shader_id, 0, 0, 0, 0, &m_program_id))
	{
		/* Success is considered an error */

		Utils::program program(m_context);
		GLuint		   index = 0;

		program.build(0, 0, 0, 0, 0, vertex_shader_code, 0, 0);

		/* Verify that recursive subroutine is active */
		try
		{
			index = program.getSubroutineIndex(name_of_recursive_routine, GL_VERTEX_SHADER);
		}
		catch (const std::exception& exc)
		{
			/* Something wrong with shader or compilation */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "It is expected that subroutine: \n"
				<< name_of_recursive_routine
				<< " is considered active. This subroutine is potentially recursive and should cause link failure."
				<< tcu::TestLog::EndMessage;

			throw exc;
		}

		/* Subsoutine is active, however linking should fail */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Program with potentially recursive subroutine, "
			<< name_of_recursive_routine << ", which is active, index: " << index << ", has been built successfully.\n"
			<< vertex_shader_code << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Delete program and shader */
	deinit();

	/* Done */
	return result;
}